

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int moveto_op_math(lyxp_set *set1,lyxp_set *set2,char *op,lyd_node *cur_node,lys_module *param_5,
                  int options)

{
  char cVar1;
  int iVar2;
  LY_ERR *pLVar3;
  int options_local;
  lys_module *local_mod_local;
  lyd_node *cur_node_local;
  char *op_local;
  lyxp_set *set2_local;
  lyxp_set *set1_local;
  
  if ((set2 == (lyxp_set *)0x0) && (*op == '-')) {
    iVar2 = lyxp_set_cast(set1,LYXP_SET_NUMBER,cur_node,param_5,options);
    if (iVar2 == 0) {
      (set1->val).num = -(set1->val).num;
      lyxp_set_free((lyxp_set *)0x0);
      set1_local._4_4_ = 0;
    }
    else {
      set1_local._4_4_ = -1;
    }
  }
  else {
    if ((set1 == (lyxp_set *)0x0) || (set2 == (lyxp_set *)0x0)) {
      __assert_fail("set1 && set2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                    ,0x15f6,
                    "int moveto_op_math(struct lyxp_set *, struct lyxp_set *, const char *, struct lyd_node *, struct lys_module *, int)"
                   );
    }
    iVar2 = lyxp_set_cast(set1,LYXP_SET_NUMBER,cur_node,param_5,options);
    if (iVar2 == 0) {
      iVar2 = lyxp_set_cast(set2,LYXP_SET_NUMBER,cur_node,param_5,options);
      if (iVar2 == 0) {
        cVar1 = *op;
        if (cVar1 == '*') {
          (set1->val).num = (set1->val).num * (set2->val).num;
        }
        else if (cVar1 == '+') {
          (set1->val).num = (set1->val).num + (set2->val).num;
        }
        else if (cVar1 == '-') {
          (set1->val).num = (set1->val).num - (set2->val).num;
        }
        else if (cVar1 == 'd') {
          (set1->val).num = (set1->val).num / (set2->val).num;
        }
        else {
          if (cVar1 != 'm') {
            pLVar3 = ly_errno_location();
            *pLVar3 = LY_EINT;
            ly_log(LY_LLERR,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                   ,0x161a);
            return -1;
          }
          (set1->val).num =
               (longdouble)((long)ROUND((set1->val).num) % (long)ROUND((set2->val).num));
        }
        set1_local._4_4_ = 0;
      }
      else {
        set1_local._4_4_ = -1;
      }
    }
    else {
      set1_local._4_4_ = -1;
    }
  }
  return set1_local._4_4_;
}

Assistant:

static int
moveto_op_math(struct lyxp_set *set1, struct lyxp_set *set2, const char *op, struct lyd_node *cur_node,
               struct lys_module *local_mod, int options)
{
    /* unary '-' */
    if (!set2 && (op[0] == '-')) {
        if (lyxp_set_cast(set1, LYXP_SET_NUMBER, cur_node, local_mod, options)) {
            return -1;
        }
        set1->val.num *= -1;
        lyxp_set_free(set2);
        return EXIT_SUCCESS;
    }

    assert(set1 && set2);

    if (lyxp_set_cast(set1, LYXP_SET_NUMBER, cur_node, local_mod, options)) {
        return -1;
    }
    if (lyxp_set_cast(set2, LYXP_SET_NUMBER, cur_node, local_mod, options)) {
        return -1;
    }

    switch (op[0]) {
    /* '+' */
    case '+':
        set1->val.num += set2->val.num;
        break;

    /* '-' */
    case '-':
        set1->val.num -= set2->val.num;
        break;

    /* '*' */
    case '*':
        set1->val.num *= set2->val.num;
        break;

    /* 'div' */
    case 'd':
        set1->val.num /= set2->val.num;
        break;

    /* 'mod' */
    case 'm':
        set1->val.num = ((long long)set1->val.num) % ((long long)set2->val.num);
        break;

    default:
        LOGINT;
        return -1;
    }

    return EXIT_SUCCESS;
}